

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ContinuousAssignSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ContinuousAssignSymbol,slang::syntax::ExpressionSyntax_const&>
          (BumpAllocator *this,ExpressionSyntax *args)

{
  ContinuousAssignSymbol *this_00;
  
  this_00 = (ContinuousAssignSymbol *)allocate(this,0x58,8);
  ast::ContinuousAssignSymbol::ContinuousAssignSymbol(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }